

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool extend_array(roaring_array_t *ra,int32_t k)

{
  _Bool _Var1;
  int32_t new_capacity;
  int iVar2;
  int iVar3;
  
  iVar2 = k + ra->size;
  if (0x10000 < iVar2) {
    __assert_fail("desired_size <= MAX_CONTAINERS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x46e9,"_Bool extend_array(roaring_array_t *, int32_t)");
  }
  if (ra->allocation_size < iVar2) {
    if (ra->size < 0x400) {
      iVar3 = iVar2 * 2;
    }
    else {
      iVar3 = iVar2 * 5 + 3;
      if (-1 < iVar2 * 5) {
        iVar3 = iVar2 * 5;
      }
      iVar3 = iVar3 >> 2;
    }
    new_capacity = 0x10000;
    if (iVar3 < 0x10000) {
      new_capacity = iVar3;
    }
    _Var1 = realloc_array(ra,new_capacity);
    return _Var1;
  }
  return true;
}

Assistant:

bool extend_array(roaring_array_t *ra, int32_t k) {
    int32_t desired_size = ra->size + k;
    assert(desired_size <= MAX_CONTAINERS);
    if (desired_size > ra->allocation_size) {
        int32_t new_capacity =
            (ra->size < 1024) ? 2 * desired_size : 5 * desired_size / 4;
        if (new_capacity > MAX_CONTAINERS) {
            new_capacity = MAX_CONTAINERS;
        }

        return realloc_array(ra, new_capacity);
    }
    return true;
}